

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::FileDescriptorProto::ByteSize(FileDescriptorProto *this)

{
  byte bVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  int iVar11;
  long lVar12;
  
  bVar1 = (byte)this->_has_bits_[0];
  iVar6 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar3 = this->name_;
      uVar8 = (uint)psVar3->_M_string_length;
      iVar6 = 2;
      if (0x7f < uVar8) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
        iVar6 = iVar6 + 1;
      }
      iVar6 = iVar6 + (int)psVar3->_M_string_length;
    }
    if ((this->_has_bits_[0] & 2) != 0) {
      psVar3 = this->package_;
      uVar8 = (uint)psVar3->_M_string_length;
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + iVar7 + (int)psVar3->_M_string_length + 1;
    }
  }
  if ((this->_has_bits_[0] & 0x1fe00) != 0) {
    if ((this->_has_bits_[0] >> 9 & 1) != 0) {
      this_00 = this->options_;
      if (this_00 == (FileOptions *)0x0) {
        this_00 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      uVar8 = FileOptions::ByteSize(this_00);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7 + 1;
    }
    if ((this->_has_bits_[0] & 0x400) != 0) {
      this_01 = this->source_code_info_;
      if (this_01 == (SourceCodeInfo *)0x0) {
        this_01 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      uVar8 = SourceCodeInfo::ByteSize(this_01);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7 + 1;
    }
  }
  iVar7 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar6 + iVar7;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      pvVar4 = (this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar12];
      uVar8 = *(uint *)((long)pvVar4 + 8);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + iVar7 + *(int *)((long)pvVar4 + 8);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar7 = (this->public_dependency_).current_size_;
  iVar11 = 0;
  iVar10 = 0;
  if (0 < iVar7) {
    lVar12 = 0;
    iVar10 = 0;
    do {
      uVar8 = (this->public_dependency_).elements_[lVar12];
      if ((int)uVar8 < 0) {
        iVar7 = 10;
      }
      else {
        iVar7 = 1;
        if (0x7f < uVar8) {
          iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
        }
      }
      iVar10 = iVar10 + iVar7;
      lVar12 = lVar12 + 1;
      iVar7 = (this->public_dependency_).current_size_;
    } while (lVar12 < iVar7);
  }
  iVar9 = (this->weak_dependency_).current_size_;
  if (0 < iVar9) {
    lVar12 = 0;
    iVar11 = 0;
    do {
      uVar8 = (this->weak_dependency_).elements_[lVar12];
      if ((int)uVar8 < 0) {
        iVar9 = 10;
      }
      else {
        iVar9 = 1;
        if (0x7f < uVar8) {
          iVar9 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
        }
      }
      iVar11 = iVar11 + iVar9;
      lVar12 = lVar12 + 1;
      iVar9 = (this->weak_dependency_).current_size_;
    } while (lVar12 < iVar9);
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar10 + iVar6 + iVar7 + iVar11 + iVar9 + iVar2;
  if (0 < iVar2) {
    lVar12 = 0;
    do {
      uVar8 = DescriptorProto::ByteSize
                        ((DescriptorProto *)
                         (this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar6 + iVar7;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      uVar8 = EnumDescriptorProto::ByteSize
                        ((EnumDescriptorProto *)
                         (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar7 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar6 + iVar7;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      uVar8 = ServiceDescriptorProto::ByteSize
                        ((ServiceDescriptorProto *)
                         (this->service_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar7 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar6 + iVar7;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      uVar8 = FieldDescriptorProto::ByteSize
                        ((FieldDescriptorProto *)
                         (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar7 = 1;
      if (0x7f < uVar8) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar8);
      }
      iVar6 = iVar6 + uVar8 + iVar7;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar5 = (this->_unknown_fields_).fields_;
  if ((pvVar5 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar5->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar7 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar6 = iVar6 + iVar7;
  }
  this->_cached_size_ = iVar6;
  return iVar6;
}

Assistant:

int FileDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string package = 2;
    if (has_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->package());
    }

  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    // optional .google.protobuf.FileOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (has_source_code_info()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->source_code_info());
    }

  }
  // repeated string dependency = 3;
  total_size += 1 * this->dependency_size();
  for (int i = 0; i < this->dependency_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->dependency(i));
  }

  // repeated int32 public_dependency = 10;
  {
    int data_size = 0;
    for (int i = 0; i < this->public_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->public_dependency(i));
    }
    total_size += 1 * this->public_dependency_size() + data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    int data_size = 0;
    for (int i = 0; i < this->weak_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->weak_dependency(i));
    }
    total_size += 1 * this->weak_dependency_size() + data_size;
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1 * this->message_type_size();
  for (int i = 0; i < this->message_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->message_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1 * this->service_size();
  for (int i = 0; i < this->service_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->service(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}